

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O2

Var Js::AtomicsObject::EntryWait(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  int32 iVar8;
  undefined4 *puVar9;
  Var pvVar10;
  Var index;
  TypedArrayBase *pTVar11;
  undefined4 extraout_var;
  WaiterList *this_00;
  undefined4 extraout_var_00;
  SharedArrayBuffer *this_01;
  uint index_00;
  uint32 timeout;
  double value;
  int in_stack_00000010;
  CallInfo local_60;
  CallInfo callInfo_local;
  ArgumentReader args;
  AutoCriticalSection autoCS;
  uint32 local_38;
  int32 local_34;
  uint32 accessIndex;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xb4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a04a85;
    *puVar9 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_60,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xb4,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a04a85;
    *puVar9 = 0;
  }
  if ((callInfo_local._0_4_ & 0xfffffc) == 0) {
    JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec12,L"Atomics.wait");
  }
  local_38 = 0;
  pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  index = Arguments::operator[]((Arguments *)&callInfo_local,2);
  pTVar11 = ValidateAndGetTypedArray(pvVar10,index,&local_38,pSVar1,true);
  pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,3);
  local_34 = JavascriptConversion::ToInt32(pvVar10,pSVar1);
  timeout = 0xffffffff;
  if (4 < (callInfo_local._0_4_ & 0xffffff)) {
    pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,4);
    BVar4 = JavascriptOperators::IsUndefinedObject(pvVar10);
    if (BVar4 == 0) {
      pvVar10 = Arguments::operator[]((Arguments *)&callInfo_local,4);
      value = JavascriptConversion::ToNumber(pvVar10,pSVar1);
      bVar3 = NumberUtilities::IsNan(value);
      if ((!bVar3) && (bVar3 = JavascriptNumber::IsPosInf(value), !bVar3)) {
        uVar5 = JavascriptConversion::ToInt32(value);
        timeout = 0;
        if (0 < (int)uVar5) {
          timeout = uVar5;
        }
      }
    }
  }
  bVar3 = AgentOfBuffer::AgentCanSuspend(pSVar1);
  if (!bVar3) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e9df,(PCWSTR)0x0);
  }
  if (pTVar11->BYTES_PER_ELEMENT != 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xcb,"(typedArrayBase->GetBytesPerElement() == 4)",
                                "typedArrayBase->GetBytesPerElement() == 4");
    if (!bVar3) goto LAB_00a04a85;
    *puVar9 = 0;
  }
  index_00 = local_38 * 4 + pTVar11->byteOffset;
  uVar6 = (*(((pTVar11->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if (uVar6 <= index_00) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xcd,
                                "(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength())",
                                "bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength()");
    if (!bVar3) goto LAB_00a04a85;
    *puVar9 = 0;
  }
  iVar7 = (*(((pTVar11->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6f])();
  this_01 = (SharedArrayBuffer *)CONCAT44(extraout_var,iVar7);
  this_00 = SharedArrayBuffer::GetWaiterList(this_01,index_00);
  args.super_Arguments.Values = (Type)&this_00->csForAccess;
  CCLock::Enter((CCLock *)args.super_Arguments.Values);
  iVar7 = (*(pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x72])(pTVar11,(ulong)local_38);
  iVar8 = JavascriptConversion::ToInt32((Var)CONCAT44(extraout_var_00,iVar7),pSVar1);
  if (local_34 == iVar8) {
    bVar3 = SharedContents::IsValidAgent(this_01->sharedContents,(DWORD_PTR)pSVar1);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      this_01 = (SharedArrayBuffer *)__tls_get_addr(&PTR_013e5f18);
      *(undefined4 *)
       &(this_01->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                  ,0xde,
                                  "(sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent))",
                                  "sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent)");
      if (!bVar3) {
LAB_00a04a85:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)
       &(this_01->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
    }
    bVar3 = WaiterList::AddAndSuspendWaiter(this_00,(DWORD_PTR)pSVar1,timeout);
    if (bVar3) {
      bVar3 = true;
    }
    else {
      WaiterList::RemoveWaiter(this_00,(DWORD_PTR)pSVar1);
      bVar3 = false;
    }
  }
  else {
    this_01 = (SharedArrayBuffer *)
              JavascriptLibrary::CreateStringFromCppLiteral<10ul>
                        ((pSVar1->super_ScriptContextBase).javascriptLibrary,
                         (char16 (*) [10])L"not-equal");
    bVar3 = false;
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&args.super_Arguments.Values);
  if (local_34 == iVar8) {
    this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
    if (bVar3) {
      this_01 = (SharedArrayBuffer *)
                JavascriptLibrary::CreateStringFromCppLiteral<3ul>(this,(char16 (*) [3])L"ok");
    }
    else {
      this_01 = (SharedArrayBuffer *)
                JavascriptLibrary::CreateStringFromCppLiteral<10ul>
                          (this,(char16 (*) [10])L"timed-out");
    }
  }
  return this_01;
}

Assistant:

Var AtomicsObject::EntryWait(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ATOMICS_FUNCTION_ENTRY_CHECKS(3, "Atomics.wait");

        uint32 accessIndex = 0;
        TypedArrayBase *typedArrayBase = ValidateAndGetTypedArray(args[1], args[2], &accessIndex, scriptContext, true /*onlyInt32*/);

        int32 value = JavascriptConversion::ToInt32(args[3], scriptContext);
        uint32 timeout = INFINITE;

        if (args.Info.Count > 4 && !JavascriptOperators::IsUndefinedObject(args[4]))
        {
            double t =JavascriptConversion::ToNumber(args[4], scriptContext);
            if (!(NumberUtilities::IsNan(t) || JavascriptNumber::IsPosInf(t)))
            {
                int32 t1 = JavascriptConversion::ToInt32(t);
                timeout = (uint32)max(0, t1);
            }
        }

        if (!AgentOfBuffer::AgentCanSuspend(scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_CannotSuspendBuffer);
        }

        Assert(typedArrayBase->GetBytesPerElement() == 4);
        uint32 bufferIndex = (accessIndex * 4) + typedArrayBase->GetByteOffset();
        Assert(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength());
        SharedArrayBuffer *sharedArrayBuffer = typedArrayBase->GetArrayBuffer()->GetAsSharedArrayBuffer();
        WaiterList *waiterList = sharedArrayBuffer->GetWaiterList(bufferIndex);


        bool awoken = false;

        {
            AutoCriticalSection autoCS(waiterList->GetCriticalSectionForAccess());

            int32 w = JavascriptConversion::ToInt32(typedArrayBase->DirectGetItem(accessIndex), scriptContext);
            if (value != w)
            {
                return scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("not-equal"));
            }

            DWORD_PTR agent = (DWORD_PTR)scriptContext;
            Assert(sharedArrayBuffer->GetSharedContents()->IsValidAgent(agent));
#pragma prefast(suppress:__WARNING_CALLER_FAILING_TO_HOLD, "This is a prefast false-positive caused by it being unable to identify that the critical section used here is the same as the one held by the AutoCriticalSection")
            awoken = waiterList->AddAndSuspendWaiter(agent, timeout);
            if (!awoken)
            {
                waiterList->RemoveWaiter(agent);
            }
        }

        return awoken ? scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("ok"))
            : scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("timed-out"));
    }